

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyPackedFlat
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix)

{
  Plausibility PVar1;
  Own<kj::Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>::Iface,_std::nullptr_t>
  OStack_38;
  anon_class_8_1_8991fb9c_for_f local_28;
  
  local_28.this = this;
  kj::Function<capnp::compiler::CompilerMain::Plausibility(kj::ArrayPtr<unsigned_char_const>)>::
  Function<capnp::compiler::CompilerMain::isPlausiblyPackedFlat(kj::ArrayPtr<unsigned_char_const>)::_lambda(kj::ArrayPtr<unsigned_char_const>)_1_>
            ((Function<capnp::compiler::CompilerMain::Plausibility(kj::ArrayPtr<unsigned_char_const>)>
              *)&OStack_38,&local_28);
  PVar1 = isPlausiblyPacked(this,prefix,
                            (Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>
                             *)&OStack_38);
  kj::
  Own<kj::Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>::Iface,_std::nullptr_t>
  ::dispose(&OStack_38);
  return PVar1;
}

Assistant:

Plausibility isPlausiblyPackedFlat(kj::ArrayPtr<const byte> prefix) {
    return isPlausiblyPacked(prefix, [this](kj::ArrayPtr<const byte> prefix) {
      return isPlausiblyFlat(prefix);
    });
  }